

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

void __thiscall HighsSearch::flushStatistics(HighsSearch *this)

{
  int64_t *piVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  long lVar3;
  long lVar4;
  
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  piVar1 = &(_Var2._M_head_impl)->num_nodes;
  *piVar1 = *piVar1 + this->nnodes;
  this->nnodes = 0;
  HighsCDouble::operator+=(&(_Var2._M_head_impl)->pruned_treeweight,&this->treeweight);
  (this->treeweight).hi = 0.0;
  (this->treeweight).lo = 0.0;
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  lVar3 = this->lpiterations;
  lVar4 = this->heurlpiterations;
  this->lpiterations = 0;
  (_Var2._M_head_impl)->total_lp_iterations = (_Var2._M_head_impl)->total_lp_iterations + lVar3;
  (_Var2._M_head_impl)->heuristic_lp_iterations =
       (_Var2._M_head_impl)->heuristic_lp_iterations + lVar4;
  this->heurlpiterations = 0;
  (_Var2._M_head_impl)->sb_lp_iterations =
       (_Var2._M_head_impl)->sb_lp_iterations + this->sblpiterations;
  this->sblpiterations = 0;
  return;
}

Assistant:

void HighsSearch::flushStatistics() {
  mipsolver.mipdata_->num_nodes += nnodes;
  nnodes = 0;

  mipsolver.mipdata_->pruned_treeweight += treeweight;
  treeweight = 0;

  mipsolver.mipdata_->total_lp_iterations += lpiterations;
  lpiterations = 0;

  mipsolver.mipdata_->heuristic_lp_iterations += heurlpiterations;
  heurlpiterations = 0;

  mipsolver.mipdata_->sb_lp_iterations += sblpiterations;
  sblpiterations = 0;
}